

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_export.cpp
# Opt level: O3

void duckdb::ExportAggregateFinalize
               (Vector *state,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  aggregate_size_t p_Var1;
  data_ptr_t pdVar2;
  pointer pBVar3;
  char *data;
  idx_t len;
  idx_t iVar4;
  data_ptr_t pdVar5;
  FunctionData *this;
  string_t sVar6;
  
  len = count;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  this = (aggr_input_data->bind_data).ptr + 1;
  pBVar3 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)this);
  p_Var1 = (pBVar3->function).state_size;
  pBVar3 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                         *)this);
  data = (char *)(*p_Var1)(&pBVar3->function);
  if (count != 0) {
    pdVar2 = state->data;
    pdVar5 = result->data + 8;
    iVar4 = 0;
    do {
      sVar6 = StringVector::AddStringOrBlob
                        ((StringVector *)result,*(Vector **)(pdVar2 + iVar4 * 8),data,len);
      *(long *)(pdVar5 + -8) = sVar6.value._0_8_;
      *(long *)pdVar5 = sVar6.value._8_8_;
      iVar4 = iVar4 + 1;
      pdVar5 = pdVar5 + 0x10;
    } while (count != iVar4);
  }
  return;
}

Assistant:

static void ExportAggregateFinalize(Vector &state, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
                                    idx_t offset) {
	D_ASSERT(offset == 0);
	auto &bind_data = aggr_input_data.bind_data->Cast<ExportAggregateFunctionBindData>();
	auto state_size = bind_data.aggregate->function.state_size(bind_data.aggregate->function);
	auto blob_ptr = FlatVector::GetData<string_t>(result);
	auto addresses_ptr = FlatVector::GetData<data_ptr_t>(state);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto data_ptr = addresses_ptr[row_idx];
		blob_ptr[row_idx] = StringVector::AddStringOrBlob(result, const_char_ptr_cast(data_ptr), state_size);
	}
}